

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::ErrorCheckAndLog
          (ErrorsTest *this,GLchar *function_name,GLenum expected_error,
          GLchar *when_shall_be_generated)

{
  GLenum GVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_200;
  GetNameFunc local_1f0;
  int local_1e8;
  Enum<int,_2UL> local_1e0 [2];
  MessageBuilder local_1c0;
  GLenum local_3c;
  long lStack_38;
  GLenum error;
  Functions *gl;
  GLchar *when_shall_be_generated_local;
  GLchar *pGStack_20;
  GLenum expected_error_local;
  GLchar *function_name_local;
  ErrorsTest *this_local;
  
  gl = (Functions *)when_shall_be_generated;
  when_shall_be_generated_local._4_4_ = expected_error;
  pGStack_20 = function_name;
  function_name_local = (GLchar *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  GVar1 = when_shall_be_generated_local._4_4_;
  lStack_38 = CONCAT44(extraout_var,iVar2);
  local_3c = 0;
  local_3c = (**(code **)(lStack_38 + 0x800))();
  if (GVar1 == local_3c) {
    this_local._7_1_ = true;
  }
  else {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1c0,&stack0xffffffffffffffe0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [20])" does not generate ");
    EVar5 = glu::getErrorStr(when_shall_be_generated_local._4_4_);
    local_1f0 = EVar5.m_getName;
    local_1e8 = EVar5.m_value;
    local_1e0[0].m_getName = local_1f0;
    local_1e0[0].m_value = local_1e8;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1e0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char **)&gl);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [20])"The error value of ");
    EVar5 = glu::getErrorStr(local_3c);
    local_200.m_getName = EVar5.m_getName;
    local_200.m_value = EVar5.m_value;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_200);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [15])" was observed.");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    do {
      iVar2 = (**(code **)(lStack_38 + 0x800))();
    } while (iVar2 != 0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ErrorsTest::ErrorCheckAndLog(const glw::GLchar* function_name, const glw::GLenum expected_error,
								  const glw::GLchar* when_shall_be_generated)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Error value storage. */
	glw::GLenum error = GL_NO_ERROR;

	/* Error comparision. */
	if (expected_error != (error = gl.getError()))
	{
		/* Log. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << function_name << " does not generate "
											<< glu::getErrorStr(expected_error) << when_shall_be_generated
											<< "The error value of " << glu::getErrorStr(error) << " was observed."
											<< tcu::TestLog::EndMessage;

		/* Error cleanup. */
		while (gl.getError())
			;

		/* Check failed. */
		return false;
	}

	/* Error was equal to expected. */
	return true;
}